

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O2

void __thiscall cmCacheManager::PrintCache(cmCacheManager *this,ostream *out)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  
  std::operator<<(out,"=================================================\nCMakeCache Contents:\n");
  for (p_Var2 = (this->Cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->Cache)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    if (p_Var2[3]._M_color != 4) {
      poVar1 = std::operator<<(out,(string *)(p_Var2 + 1));
      poVar1 = std::operator<<(poVar1," = ");
      poVar1 = std::operator<<(poVar1,(string *)(p_Var2 + 2));
      std::operator<<(poVar1,'\n');
    }
  }
  std::operator<<(out,
                  "\n\nTo change values in the CMakeCache, \nedit CMakeCache.txt in your output directory.\n=================================================\n"
                 );
  return;
}

Assistant:

void cmCacheManager::PrintCache(std::ostream& out) const
{
  out << "=================================================\n"
         "CMakeCache Contents:\n";
  for (auto const& i : this->Cache) {
    if (i.second.Type != cmStateEnums::INTERNAL) {
      out << i.first << " = " << i.second.Value << '\n';
    }
  }
  out << "\n\n"
         "To change values in the CMakeCache, \n"
         "edit CMakeCache.txt in your output directory.\n"
         "=================================================\n";
}